

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

void __thiscall
Potassco::AspifTextOutput::rule
          (AspifTextOutput *this,Head_t ht,AtomSpan *head,Weight_t bound,WeightLitSpan *lits)

{
  int iVar1;
  pointer puVar2;
  pointer puVar3;
  size_t sVar4;
  Weight_t WVar5;
  WeightLit_t *pWVar6;
  Weight_t WVar7;
  long lVar8;
  LitSpan local_48;
  
  if (lits->size == 0) {
    local_48.first = (int *)0x0;
    local_48.size = 0;
    rule(this,ht,head,&local_48);
  }
  push(this,1);
  push(this,ht.val_);
  push(this,head);
  puVar2 = (this->data_->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->data_->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  WVar5 = lits->first->weight;
  push(this,1);
  push(this,bound);
  push(this,(uint32_t)lits->size);
  pWVar6 = lits->first;
  WVar7 = WVar5;
  for (lVar8 = lits->size << 3; lVar8 != 0; lVar8 = lVar8 + -8) {
    push(this,pWVar6->lit);
    push(this,pWVar6->weight);
    iVar1 = pWVar6->weight;
    if (iVar1 < WVar7) {
      WVar7 = iVar1;
    }
    if (WVar5 < iVar1) {
      WVar5 = iVar1;
    }
    pWVar6 = pWVar6 + 1;
  }
  if (WVar7 == WVar5) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->data_->directives,(ulong)((long)puVar2 - (long)puVar3) >> 2 & 0xffffffff);
    push(this,2);
    push(this,(bound + WVar5 + -1) / WVar5);
    push(this,(uint32_t)lits->size);
    pWVar6 = lits->first;
    sVar4 = lits->size;
    for (lVar8 = 0; sVar4 << 3 != lVar8; lVar8 = lVar8 + 8) {
      push(this,*(uint32_t *)((long)&pWVar6->lit + lVar8));
    }
  }
  return;
}

Assistant:

void AspifTextOutput::rule(Head_t ht, const AtomSpan& head, Weight_t bound, const WeightLitSpan& lits) {
	if (size(lits) == 0) {
		AspifTextOutput::rule(ht, head, toSpan<Lit_t>());
	}
	push(Directive_t::Rule).push(static_cast<uint32_t>(ht)).push(head);
	uint32_t top = static_cast<uint32_t>(data_->directives.size());
	Weight_t min = weight(*begin(lits)), max = min;
	push(Body_t::Sum).push(bound).push(static_cast<uint32_t>(size(lits)));
	for (const WeightLit_t* it = begin(lits), *end = Potassco::end(lits); it != end; ++it) {
		push(Potassco::lit(*it)).push(Potassco::weight(*it));
		if (Potassco::weight(*it) < min) { min = Potassco::weight(*it); }
		if (Potassco::weight(*it) > max) { max = Potassco::weight(*it); }
	}
	if (min == max) {
		data_->directives.resize(top);
		bound = (bound + min-1)/min;
		push(Body_t::Count).push(bound).push(static_cast<uint32_t>(size(lits)));
		for (const WeightLit_t* it = begin(lits), *end = Potassco::end(lits); it != end; ++it) {
			push(Potassco::lit(*it));
		}
	}
}